

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O0

bool stackjit::TypeSystem::getClassAndFieldName(string *str,string *className,string *fieldName)

{
  bool bVar1;
  string local_70 [32];
  string local_50 [32];
  long local_30;
  size_type fieldSepPos;
  string *fieldName_local;
  string *className_local;
  string *str_local;
  
  fieldSepPos = (size_type)fieldName;
  fieldName_local = className;
  className_local = str;
  local_30 = std::__cxx11::string::find((char *)str,0x25b169);
  bVar1 = local_30 != -1;
  if (bVar1) {
    std::__cxx11::string::substr((ulong)local_50,(ulong)str);
    std::__cxx11::string::operator=((string *)fieldName_local,local_50);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::substr((ulong)local_70,(ulong)str);
    std::__cxx11::string::operator=((string *)fieldSepPos,local_70);
    std::__cxx11::string::~string(local_70);
  }
  return bVar1;
}

Assistant:

bool TypeSystem::getClassAndFieldName(std::string str,  std::string& className, std::string& fieldName) {
	    auto fieldSepPos = str.find("::");

	    if (fieldSepPos != std::string::npos) {
	        className = str.substr(0, fieldSepPos);
	        fieldName = str.substr(fieldSepPos + 2);
	        return true;
	    } else {
	    	return false;
	    }
	}